

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O2

void duckdb::WriteDataToPrimitiveSegment<unsigned_char>
               (ListSegmentFunctions *param_1,ArenaAllocator *param_2,ListSegment *segment,
               RecursiveUnifiedVectorFormat *input_data,idx_t *entry_idx)

{
  ushort uVar1;
  sel_t *psVar2;
  bool bVar3;
  idx_t row_idx;
  
  row_idx = *entry_idx;
  psVar2 = ((input_data->unified).sel)->sel_vector;
  if (psVar2 != (sel_t *)0x0) {
    row_idx = (idx_t)psVar2[row_idx];
  }
  bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&(input_data->unified).validity.super_TemplatedValidityMask<unsigned_long>,
                     row_idx);
  uVar1 = segment->count;
  *(bool *)((long)&segment[1].count + (ulong)uVar1) = !bVar3;
  if (bVar3) {
    *(data_t *)((long)&segment[1].count + (ulong)uVar1 + (ulong)segment->capacity) =
         (input_data->unified).data[row_idx];
  }
  return;
}

Assistant:

static void WriteDataToPrimitiveSegment(const ListSegmentFunctions &, ArenaAllocator &, ListSegment *segment,
                                        RecursiveUnifiedVectorFormat &input_data, idx_t &entry_idx) {

	auto sel_entry_idx = input_data.unified.sel->get_index(entry_idx);

	// write null validity
	auto null_mask = GetNullMask(segment);
	auto valid = input_data.unified.validity.RowIsValid(sel_entry_idx);
	null_mask[segment->count] = !valid;

	// write value
	if (valid) {
		auto segment_data = GetPrimitiveData<T>(segment);
		auto input_data_ptr = UnifiedVectorFormat::GetData<T>(input_data.unified);
		Store<T>(input_data_ptr[sel_entry_idx], data_ptr_cast(segment_data + segment->count));
	}
}